

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_info.cpp
# Opt level: O0

ktx_error_code_e __thiscall ktx::CommandInfo::printInfoText(CommandInfo *this,istream *file)

{
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view filepath;
  ushort uVar1;
  undefined2 uVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> *this_00;
  ktxStream *pkVar7;
  char **args_03;
  char *extraout_RDX;
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> *in_RSI;
  v10 *this_01;
  long in_RDI;
  ktx_error_code_e result;
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> ktx2Stream;
  __string_type validationMessages;
  int validationResult;
  ostringstream messagesOS;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*> *vargs;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *vargs_3;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *vargs_1;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_2;
  undefined4 in_stack_fffffffffffff958;
  undefined4 in_stack_fffffffffffff95c;
  fpos<__mbstate_t> *in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff968;
  undefined4 in_stack_fffffffffffff96c;
  function<void_(const_ktx::ValidationReport_&)> *in_stack_fffffffffffff970;
  undefined7 in_stack_fffffffffffff978;
  undefined1 in_stack_fffffffffffff97f;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_stack_fffffffffffff980;
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> *this_02;
  char *in_stack_fffffffffffff988;
  size_t in_stack_fffffffffffff990;
  size_t in_stack_fffffffffffff9b0;
  char *in_stack_fffffffffffff9b8;
  size_t *psVar8;
  undefined8 local_5a0;
  undefined8 local_598;
  char *local_590 [2];
  char *local_580;
  size_t local_578;
  char *local_570 [2];
  string local_560 [32];
  undefined1 local_540 [8];
  char *local_538 [2];
  ostringstream *local_528;
  undefined1 local_4f0 [16];
  v10 local_4e0 [36];
  int local_4bc;
  ostringstream local_4b8 [376];
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> *local_340;
  ktx_error_code_e local_32c;
  undefined8 local_328;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  **local_320;
  char *local_318;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  *local_308 [2];
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  **local_2f8;
  function<void_(const_ktx::ValidationReport_&)> *in_stack_fffffffffffffd10;
  undefined1 local_2e8 [6];
  undefined2 uVar9;
  string *in_stack_fffffffffffffd20;
  istream *in_stack_fffffffffffffd28;
  char *pcVar10;
  undefined8 local_2c8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_2c0;
  char *local_2b8;
  size_t local_2b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_2a8 [3];
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_290;
  char *local_288;
  size_t sStack_280;
  undefined8 local_278;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_270;
  char *local_268;
  size_t local_260;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_258 [3];
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_240;
  char *local_238;
  size_t sStack_230;
  char *local_228;
  char **local_220;
  char *local_218;
  char **local_210;
  undefined8 local_208;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_200;
  char *local_1f8;
  size_t local_1f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1e8 [3];
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_1d0;
  string *local_1c8;
  char *local_1c0;
  size_t sStack_1b8;
  char *local_1b0;
  char **local_1a8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_1a0;
  undefined8 *local_198;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_190;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_188;
  undefined8 local_180;
  undefined8 *local_178;
  char *local_170;
  char **local_168;
  char *local_160;
  char **local_158;
  char *local_150;
  char **local_148;
  char *local_140;
  char **local_138;
  char **local_130;
  char *local_128;
  size_t sStack_120;
  char **local_110;
  char *local_108;
  size_t sStack_100;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_f0;
  undefined8 *local_e8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_e0;
  undefined8 local_d8;
  undefined8 *local_d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_c8;
  undefined8 *local_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_b8;
  undefined8 local_b0;
  undefined8 *local_a8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_98;
  char **local_90;
  char *local_88;
  size_t sStack_80;
  undefined1 *local_70;
  char *local_68;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  **local_50;
  undefined8 *local_48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  **local_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  **local_38;
  undefined8 local_30;
  undefined8 *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  char *local_8;
  
  uVar9 = (undefined2)((ulong)_local_2e8 >> 0x30);
  local_340 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_4b8);
  local_4f0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(in_RDI + 0x50));
  filepath._M_str = in_stack_fffffffffffff9b8;
  filepath._M_len = in_stack_fffffffffffff9b0;
  fmtInFile_abi_cxx11_(filepath);
  local_528 = local_4b8;
  std::function<void(ktx::ValidationReport_const&)>::
  function<ktx::CommandInfo::printInfoText(std::istream&)::__0,void>
            (in_stack_fffffffffffff970,
             (anon_class_8_1_38b231ee *)
             CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
  uVar2 = uVar9;
  this_01 = local_4e0;
  uVar1 = (ushort)uVar9 >> 8;
  iVar4 = validateIOStream(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,SUB21(uVar1,0),
                           SUB21(uVar2,0),in_stack_fffffffffffffd10);
  std::function<void_(const_ktx::ValidationReport_&)>::~function
            ((function<void_(const_ktx::ValidationReport_&)> *)0x29ead8);
  std::__cxx11::string::~string((string *)local_4e0);
  local_138 = local_538;
  pcVar10 = "Validation {}\n";
  local_140 = "Validation {}\n";
  local_538[0] = "Validation {}\n";
  local_4bc = iVar4;
  std::char_traits<char>::length((char_type *)0x29eb5e);
  local_540 = (undefined1  [8])0x3a94b5;
  if (local_4bc == 0) {
    local_540 = (undefined1  [8])0x386118;
  }
  _local_2e8 = local_538[0];
  local_20 = pcVar10;
  local_308[0] = ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char_const*>
                           ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
                             *)local_540,this_01,args_03);
  local_2f8 = local_308;
  local_70 = local_2e8;
  local_318 = _local_2e8;
  local_48 = &local_328;
  local_30 = 0xc;
  local_328 = 0xc;
  fmt.size_ = in_stack_fffffffffffff990;
  fmt.data_ = in_stack_fffffffffffff988;
  args.desc_._7_1_ = in_stack_fffffffffffff97f;
  args.desc_._0_7_ = in_stack_fffffffffffff978;
  args.field_1.values_ = in_stack_fffffffffffff980.values_;
  local_68 = local_318;
  local_50 = local_2f8;
  local_40 = local_2f8;
  local_38 = local_2f8;
  local_28 = local_48;
  local_320 = local_2f8;
  ::fmt::v10::vprint(fmt,args);
  std::__cxx11::ostringstream::str();
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    local_220 = local_570;
    local_228 = "\n";
    local_150 = "\n";
    local_570[0] = "\n";
    local_148 = local_220;
    sStack_230 = std::char_traits<char>::length((char_type *)0x29edab);
    local_10 = local_228;
    local_238 = local_570[0];
    local_258[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_240 = local_258;
    local_130 = &local_238;
    local_268 = local_238;
    local_260 = sStack_230;
    local_e8 = &local_278;
    local_d8 = 0;
    local_278 = 0;
    fmt_00.size_ = in_stack_fffffffffffff990;
    fmt_00.data_ = in_stack_fffffffffffff988;
    args_00.desc_._7_1_ = in_stack_fffffffffffff97f;
    args_00.desc_._0_7_ = in_stack_fffffffffffff978;
    args_00.field_1.values_ = in_stack_fffffffffffff980.values_;
    local_128 = local_268;
    sStack_120 = local_260;
    local_f0 = local_240;
    local_e0 = local_240;
    local_d0 = local_e8;
    local_98 = local_240;
    local_270 = local_240;
    ::fmt::v10::vprint(fmt_00,args_00);
    local_1a8 = &local_580;
    local_1b0 = "{}";
    local_170 = "{}";
    local_580 = "{}";
    psVar8 = &local_578;
    local_168 = local_1a8;
    sVar6 = std::char_traits<char>::length((char_type *)0x29ef82);
    *psVar8 = sVar6;
    local_8 = local_1b0;
    local_1c0 = local_580;
    sStack_1b8 = local_578;
    local_1c8 = local_560;
    local_1e8[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
    local_1d0 = local_1e8;
    local_90 = &local_1c0;
    local_1f8 = local_1c0;
    local_1f0 = sStack_1b8;
    local_198 = &local_208;
    local_180 = 0xd;
    local_208 = 0xd;
    fmt_01.size_ = in_stack_fffffffffffff990;
    fmt_01.data_ = in_stack_fffffffffffff988;
    args_01.desc_._7_1_ = in_stack_fffffffffffff97f;
    args_01.desc_._0_7_ = in_stack_fffffffffffff978;
    args_01.field_1.values_ = in_stack_fffffffffffff980.values_;
    local_1a0 = local_1d0;
    local_190 = local_1d0;
    local_188 = local_1d0;
    local_178 = local_198;
    local_88 = local_1f8;
    sStack_80 = local_1f0;
    local_200 = local_1d0;
    ::fmt::v10::vprint(fmt_01,args_01);
  }
  local_210 = local_590;
  local_218 = "\n";
  local_160 = "\n";
  local_590[0] = "\n";
  local_158 = local_210;
  sStack_280 = std::char_traits<char>::length((char_type *)0x29f1cf);
  local_18 = local_218;
  local_288 = local_590[0];
  local_2a8[0] = ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
  local_290 = local_2a8;
  local_110 = &local_288;
  local_2b8 = local_288;
  local_2b0 = sStack_280;
  local_c0 = &local_2c8;
  local_b0 = 0;
  local_2c8 = 0;
  fmt_02.size_ = (size_t)local_2a8[0];
  fmt_02.data_ = extraout_RDX;
  args_02.desc_._7_1_ = in_stack_fffffffffffff97f;
  args_02.desc_._0_7_ = in_stack_fffffffffffff978;
  args_02.field_1.values_ = in_stack_fffffffffffff980.values_;
  local_108 = local_2b8;
  sStack_100 = local_2b0;
  local_c8 = local_290;
  local_b8 = local_290;
  local_a8 = local_c0;
  local_a0 = local_290;
  local_2c0 = local_290;
  ::fmt::v10::vprint(fmt_02,args_02);
  std::ios::clear((int)local_340 + (int)local_340->_vptr_StreambufStream[-3]);
  this_02 = local_340;
  std::fpos<__mbstate_t>::fpos
            (in_stack_fffffffffffff960,CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958)
            );
  std::istream::seekg(this_02,local_5a0,local_598);
  bVar3 = std::ios::operator!((ios *)((long)&local_340->_vptr_StreambufStream +
                                     (long)local_340->_vptr_StreambufStream[-3]));
  if ((bVar3 & 1) == 0) {
    this_00 = (StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> *)
              std::ios::rdbuf();
    std::operator|(_S_in,_S_bin);
    StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::StreambufStream
              (this_02,(basic_streambuf<char,_std::char_traits<char>_> *)
                       CONCAT17(bVar3,in_stack_fffffffffffff978),(openmode)((ulong)this_00 >> 0x20))
    ;
    pkVar7 = StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::stream
                       ((StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> *)
                        0x29f436);
    local_32c = ktxPrintKTX2InfoTextForStream(pkVar7);
    if (local_4bc != 0) {
      local_32c = KTX_SUCCESS;
    }
    StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::~StreambufStream
              (this_00);
  }
  else {
    local_32c = KTX_SUCCESS;
    if (local_4bc == 0) {
      local_32c = KTX_FILE_SEEK_ERROR;
    }
  }
  std::__cxx11::string::~string(local_560);
  std::__cxx11::ostringstream::~ostringstream(local_4b8);
  return local_32c;
}

Assistant:

KTX_error_code CommandInfo::printInfoText(std::istream& file) {
    std::ostringstream messagesOS;
    const auto validationResult = validateIOStream(file, fmtInFile(options.inputFilepath), false, false, [&](const ValidationReport& issue) {
        fmt::print(messagesOS, "{}-{:04}: {}\n", toString(issue.type), issue.id, issue.message);
        fmt::print(messagesOS, "    {}\n", issue.details);
    });

    fmt::print("Validation {}\n", validationResult == 0 ? "successful" : "failed");
    const auto validationMessages = std::move(messagesOS).str();
    if (!validationMessages.empty()) {
        fmt::print("\n");
        fmt::print("{}", validationMessages);
    }
    fmt::print("\n");

    file.clear(); // Clear any unexpected EOF from validation
    file.seekg(0);
    if (!file)
        return validationResult == 0 ? KTX_FILE_SEEK_ERROR : KTX_SUCCESS;

    StreambufStream<std::streambuf*> ktx2Stream{file.rdbuf(), std::ios::in | std::ios::binary};
    const auto result = ktxPrintKTX2InfoTextForStream(ktx2Stream.stream());

    return validationResult == 0 ? result : KTX_SUCCESS;
}